

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  byte bVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_DiagnosticInfo *pUVar5;
  uint uVar6;
  
  uVar6 = 0;
  do {
    pUVar1 = pos + 1;
    if (end < pUVar1) {
      UVar3 = 0x80070000;
LAB_0011242d:
      return UVar3 | uVar6;
    }
    bVar2 = *pos;
    UVar3 = 0;
    pos = pUVar1;
    if ((bVar2 & 1) != 0) {
      *(byte *)dst = *(byte *)dst | 1;
      UVar3 = Int32_decodeBinary(&dst->symbolicId);
    }
    if ((bVar2 & 2) != 0) {
      *(byte *)dst = *(byte *)dst | 2;
      UVar4 = Int32_decodeBinary(&dst->namespaceUri);
      UVar3 = UVar3 | UVar4;
    }
    if ((bVar2 & 4) != 0) {
      *(byte *)dst = *(byte *)dst | 4;
      UVar4 = Int32_decodeBinary(&dst->localizedText);
      UVar3 = UVar3 | UVar4;
    }
    if ((bVar2 & 8) != 0) {
      *(byte *)dst = *(byte *)dst | 8;
      UVar4 = Int32_decodeBinary(&dst->locale);
      UVar3 = UVar3 | UVar4;
    }
    if ((bVar2 & 0x10) != 0) {
      *(byte *)dst = *(byte *)dst | 0x10;
      UVar4 = String_decodeBinary(&dst->additionalInfo,_);
      UVar3 = UVar3 | UVar4;
    }
    if ((bVar2 & 0x20) != 0) {
      *(byte *)dst = *(byte *)dst | 0x20;
      UVar4 = StatusCode_decodeBinary(&dst->innerStatusCode);
      UVar3 = UVar3 | UVar4;
    }
    if ((bVar2 & 0x40) == 0) goto LAB_0011242d;
    _ = (UA_DataType *)0x38;
    pUVar5 = (UA_DiagnosticInfo *)calloc(1,0x38);
    dst->innerDiagnosticInfo = pUVar5;
    if (pUVar5 == (UA_DiagnosticInfo *)0x0) {
      UVar3 = 0x80030000;
      goto LAB_0011242d;
    }
    *(byte *)dst = *(byte *)dst | 0x40;
    uVar6 = uVar6 | UVar3;
    dst = pUVar5;
  } while( true );
}

Assistant:

static UA_StatusCode
DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasSymbolicId = true;
        retval |= Int32_decodeBinary(&dst->symbolicId);
    }
    if(encodingMask & 0x02) {
        dst->hasNamespaceUri = true;
        retval |= Int32_decodeBinary(&dst->namespaceUri);
    }
    if(encodingMask & 0x04) {
        dst->hasLocalizedText = true;
        retval |= Int32_decodeBinary(&dst->localizedText);
    }
    if(encodingMask & 0x08) {
        dst->hasLocale = true;
        retval |= Int32_decodeBinary(&dst->locale);
    }
    if(encodingMask & 0x10) {
        dst->hasAdditionalInfo = true;
        retval |= String_decodeBinary(&dst->additionalInfo, NULL);
    }
    if(encodingMask & 0x20) {
        dst->hasInnerStatusCode = true;
        retval |= StatusCode_decodeBinary(&dst->innerStatusCode);
    }
    if(encodingMask & 0x40) {
        /* innerDiagnosticInfo is allocated on the heap */
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_calloc(1, sizeof(UA_DiagnosticInfo));
        if(!dst->innerDiagnosticInfo)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        dst->hasInnerDiagnosticInfo = true;
        retval |= DiagnosticInfo_decodeBinary(dst->innerDiagnosticInfo, NULL);
    }
    return retval;
}